

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::UpdateActiveFunctionSet
          (FunctionBody *this,ActiveFunctionSet *pActiveFuncs,
          FunctionCodeGenRuntimeData *callSiteData)

{
  bool bVar1;
  ProfileId PVar2;
  uint uVar3;
  Type *pTVar4;
  Type *data_3;
  Type *data_2;
  Type *data_1;
  Type *data;
  FunctionCodeGenRuntimeData *callSiteData_local;
  ActiveFunctionSet *pActiveFuncs_local;
  FunctionBody *this_local;
  
  if (callSiteData != (FunctionCodeGenRuntimeData *)0x0) {
    pTVar4 = FunctionCodeGenRuntimeData::GetInlinees(callSiteData);
    if (pTVar4 != (Type *)0x0) {
      pTVar4 = FunctionCodeGenRuntimeData::GetInlinees(callSiteData);
      PVar2 = GetProfiledCallSiteCount(this);
      UpdateActiveFunctionsForOneDataSet(this,pActiveFuncs,callSiteData,pTVar4,(uint)PVar2);
    }
    pTVar4 = FunctionCodeGenRuntimeData::GetLdFldInlinees(callSiteData);
    if (pTVar4 != (Type *)0x0) {
      pTVar4 = FunctionCodeGenRuntimeData::GetLdFldInlinees(callSiteData);
      uVar3 = GetInlineCacheCount(this);
      UpdateActiveFunctionsForOneDataSet(this,pActiveFuncs,callSiteData,pTVar4,uVar3);
    }
    pTVar4 = FunctionCodeGenRuntimeData::GetCallbackInlinees(callSiteData);
    if (pTVar4 != (Type *)0x0) {
      pTVar4 = FunctionCodeGenRuntimeData::GetCallbackInlinees(callSiteData);
      PVar2 = GetProfiledCallSiteCount(this);
      UpdateActiveFunctionsForOneDataSet(this,pActiveFuncs,callSiteData,pTVar4,(uint)PVar2);
    }
    pTVar4 = FunctionCodeGenRuntimeData::GetCallApplyTargetInlinees(callSiteData);
    if (pTVar4 != (Type *)0x0) {
      pTVar4 = FunctionCodeGenRuntimeData::GetCallApplyTargetInlinees(callSiteData);
      PVar2 = GetProfiledCallApplyCallSiteCount(this);
      UpdateActiveFunctionsForOneDataSet(this,pActiveFuncs,callSiteData,pTVar4,(uint)PVar2);
    }
  }
  bVar1 = TestAndUpdateActiveFunctions(this,pActiveFuncs);
  if (!bVar1) {
    pTVar4 = GetCodeGenRuntimeData(this);
    if (pTVar4 != (Type *)0x0) {
      PVar2 = GetProfiledCallSiteCount(this);
      UpdateActiveFunctionsForOneDataSet
                (this,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pTVar4,(uint)PVar2);
    }
    pTVar4 = GetCodeGenGetSetRuntimeData(this);
    if (pTVar4 != (Type *)0x0) {
      uVar3 = GetInlineCacheCount(this);
      UpdateActiveFunctionsForOneDataSet
                (this,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pTVar4,uVar3);
    }
    pTVar4 = GetCodeGenCallbackRuntimeData(this);
    if (pTVar4 != (Type *)0x0) {
      PVar2 = GetProfiledCallSiteCount(this);
      UpdateActiveFunctionsForOneDataSet
                (this,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pTVar4,(uint)PVar2);
    }
    pTVar4 = GetCodeGenCallApplyTargetRuntimeData(this);
    if (pTVar4 != (Type *)0x0) {
      PVar2 = GetProfiledCallApplyCallSiteCount(this);
      UpdateActiveFunctionsForOneDataSet
                (this,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pTVar4,(uint)PVar2);
    }
  }
  return;
}

Assistant:

void FunctionBody::UpdateActiveFunctionSet(ActiveFunctionSet *pActiveFuncs, FunctionCodeGenRuntimeData *callSiteData) const
    {
        // Always walk the inlinee and ldFldInlinee data (if we have them), as they are different at each call site.
        if (callSiteData)
        {
            if (callSiteData->GetInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetInlinees(), this->GetProfiledCallSiteCount());
            }
            if (callSiteData->GetLdFldInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetLdFldInlinees(), this->GetInlineCacheCount());
            }
            if (callSiteData->GetCallbackInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetCallbackInlinees(), this->GetProfiledCallSiteCount());
            }
            if (callSiteData->GetCallApplyTargetInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetCallApplyTargetInlinees(), this->GetProfiledCallApplyCallSiteCount());
            }
        }

        // Now walk the top-level data, but only do it once, since it's always the same.

        if (this->TestAndUpdateActiveFunctions(pActiveFuncs))
        {
            return;
        }
        {
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetProfiledCallSiteCount());
            }
        }
        {
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenGetSetRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetInlineCacheCount());
            }
        }
        {
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenCallbackRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetProfiledCallSiteCount());
            }
        }
        {
#if ENABLE_NATIVE_CODEGEN
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenCallApplyTargetRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetProfiledCallApplyCallSiteCount());
            }
#endif
        }
    }